

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O2

FT_Bool tt_face_get_paint(TT_Face face,FT_OpaquePaint opaque_paint,FT_COLR_Paint *paint)

{
  FT_F2Dot14 *pFVar1;
  FT_Affine23 *pFVar2;
  FT_Pos *pFVar3;
  FT_OpaquePaint *pFVar4;
  FT_Vector *pFVar5;
  FT_Bool *pFVar6;
  ushort *puVar7;
  byte *pbVar8;
  byte bVar9;
  Colr *colr;
  void *pvVar10;
  FT_Size pFVar11;
  FT_Face_Internal pFVar12;
  FT_ULong FVar13;
  long lVar14;
  long lVar15;
  FT_Bool FVar16;
  long lVar17;
  long lVar18;
  short sVar19;
  uint uVar20;
  FT_UInt num_deltas;
  FT_Fixed FVar21;
  uint *puVar22;
  uint *puVar23;
  FT_Pos FVar24;
  ulong uVar25;
  FT_PaintFormat FVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  FT_Byte *child_table_p;
  uint *local_50;
  FT_Matrix local_48;
  
  puVar22 = (uint *)opaque_paint.p;
  colr = (Colr *)face->colr;
  if (colr == (Colr *)0x0) {
    return '\0';
  }
  if (colr->base_glyphs_v1 == (FT_Byte *)0x0) {
    return '\0';
  }
  pvVar10 = colr->table;
  if (pvVar10 == (void *)0x0) {
    return '\0';
  }
  if (opaque_paint.insert_root_transform != '\0') {
    paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;
    (paint->u).glyph.paint.p = (FT_Byte *)puVar22;
    *(undefined1 *)((long)&paint->u + 8) = 0;
    pFVar11 = (face->root).size;
    lVar17 = (pFVar11->metrics).x_scale + 0x20;
    lVar18 = lVar17 >> 6;
    local_48.xx._0_2_ = (short)lVar18;
    local_48.xx._2_2_ = (short)((ulong)lVar18 >> 0x10);
    local_48.xx._4_4_ = (int)(lVar17 >> 0x26);
    local_48.xy._0_4_ = 0;
    local_48.xy._4_4_ = 0;
    local_48.yx._0_4_ = 0;
    local_48.yx._4_4_ = 0;
    local_48.yy = (pFVar11->metrics).y_scale + 0x20 >> 6;
    pFVar12 = (face->root).internal;
    if ((pFVar12->transform_flags & 1) == 0) {
      FVar24 = 0;
      FVar21 = 0;
    }
    else {
      FT_Matrix_Multiply(&pFVar12->transform_matrix,&local_48);
      lVar18 = CONCAT44(local_48.xx._4_4_,CONCAT22(local_48.xx._2_2_,(short)local_48.xx));
      FVar21 = CONCAT44(local_48.xy._4_4_,(int)local_48.xy);
      FVar24 = CONCAT44(local_48.yx._4_4_,(int)local_48.yx);
    }
    (paint->u).transform.affine.xx = lVar18;
    (paint->u).transform.affine.xy = FVar21;
    (paint->u).linear_gradient.p0.y = FVar24;
    (paint->u).linear_gradient.p1.x = local_48.yy;
    pFVar12 = (face->root).internal;
    if ((pFVar12->transform_flags & 2) == 0) {
      (paint->u).linear_gradient.p0.x = 0;
      (paint->u).linear_gradient.p1.y = 0;
      return '\x01';
    }
    (paint->u).linear_gradient.p0.x = (pFVar12->transform_delta).x << 10;
    (paint->u).linear_gradient.p1.y = (((face->root).internal)->transform_delta).y << 10;
    return '\x01';
  }
  child_table_p = (FT_Byte *)0x0;
  local_48.xx._0_2_ = 0;
  local_48.xx._2_2_ = 0;
  local_48.xx._4_4_ = 0;
  local_48.xy._0_4_ = 0;
  local_48.xy._4_4_ = 0;
  local_48.yx._0_4_ = 0;
  local_48.yx._4_4_ = 0;
  if (puVar22 == (uint *)0x0) {
    return '\0';
  }
  if (puVar22 < colr->paints_start_v1) {
    return '\0';
  }
  FVar13 = colr->table_size;
  puVar23 = (uint *)((long)pvVar10 + (FVar13 - 2));
  if (puVar23 < puVar22) {
    return '\0';
  }
  local_50 = (uint *)((long)puVar22 + 1);
  bVar9 = (byte)*puVar22;
  paint->format = (uint)bVar9;
  if (bVar9 < FT_COLR_PAINT_FORMAT_MAX) {
    if (bVar9 - 2 < 2) {
      if ((uint *)((long)pvVar10 + (FVar13 - 4)) < local_50) {
        return '\0';
      }
      (paint->u).solid.color.palette_index =
           *(ushort *)((long)puVar22 + 1) << 8 | *(ushort *)((long)puVar22 + 1) >> 8;
      (paint->u).solid.color.alpha =
           *(ushort *)((long)puVar22 + 3) << 8 | *(ushort *)((long)puVar22 + 3) >> 8;
      if (bVar9 == 3) {
        if ((byte *)((long)puVar22 + 5U) < colr->paints_start_v1) {
          return '\0';
        }
        if ((byte *)((long)colr->table + (colr->table_size - 4)) < (byte *)((long)puVar22 + 5U)) {
          return '\0';
        }
        uVar20 = *(uint *)((long)puVar22 + 5);
        get_deltas_for_var_index_base
                  (face,colr,
                   (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18),1,(FT_ItemVarDelta *)&local_48);
        pFVar1 = &(paint->u).solid.color.alpha;
        *pFVar1 = *pFVar1 + (short)local_48.xx;
      }
      paint->format = FT_COLR_PAINTFORMAT_SOLID;
      return '\x01';
    }
    if (bVar9 == 0xb) {
      if (puVar23 < local_50) {
        return '\0';
      }
      *(uint *)&paint->u =
           (uint)(ushort)(*(ushort *)((long)puVar22 + 1) << 8 | *(ushort *)((long)puVar22 + 1) >> 8)
      ;
      return '\x01';
    }
    if (bVar9 == 1) {
      bVar9 = *(byte *)local_50;
      if (colr->num_layers_v1 < (ulong)bVar9) {
        return '\0';
      }
      uVar20 = *(uint *)((long)puVar22 + 2);
      uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      if (colr->num_layers_v1 < (ulong)(uVar20 + bVar9)) {
        return '\0';
      }
      *(uint *)&paint->u = (uint)bVar9;
      (paint->u).colr_layers.layer_iterator.layer = 0;
      *(FT_Byte **)&(paint->u).glyph.paint.insert_root_transform =
           colr->layers_v1 + (ulong)(uVar20 << 2) + 4;
      return '\x01';
    }
    FVar16 = get_child_table_pointer(colr,(FT_Byte *)puVar22,(FT_Byte **)&local_50,&child_table_p);
    if (FVar16 == '\0') {
      return '\0';
    }
    FVar26 = paint->format;
    if (FVar26 == FT_COLR_PAINTFORMAT_LINEAR_GRADIENT) {
      FVar16 = '\0';
    }
    else {
      FVar16 = '\x01';
      if (FVar26 != (FT_COLR_PAINTFORMAT_LINEAR_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
        if (FVar26 == FT_COLR_PAINTFORMAT_RADIAL_GRADIENT) {
          FVar16 = '\0';
        }
        else {
          FVar16 = '\x01';
          if (FVar26 != (FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
            if (FVar26 == FT_COLR_PAINTFORMAT_SWEEP_GRADIENT) {
              FVar16 = '\0';
            }
            else {
              switch(FVar26) {
              case FT_COLR_PAINTFORMAT_SWEEP_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS:
                FVar16 = '\x01';
                break;
              case FT_COLR_PAINTFORMAT_GLYPH:
                if (local_50 < colr->paints_start_v1) {
                  return '\0';
                }
                if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_50) {
                  return '\0';
                }
                (paint->u).glyph.paint.p = child_table_p;
                *(undefined1 *)((long)&paint->u + 8) = 0;
                *(uint *)((long)&paint->u + 0x10) =
                     (uint)(ushort)((ushort)*local_50 << 8 | (ushort)*local_50 >> 8);
                return '\x01';
              default:
                if ((FVar26 & ~(FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS)
                    ) == FT_COLR_PAINTFORMAT_SCALE) {
                  (paint->u).glyph.paint.p = child_table_p;
                  *(undefined1 *)((long)&paint->u + 8) = 0;
                  if (local_50 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_50) {
                    return '\0';
                  }
                  puVar22 = (uint *)((long)local_50 + 2);
                  FVar21 = ((long)(short)((ushort)(byte)*local_50 << 8) |
                           (ulong)*(byte *)((long)local_50 + 1)) << 2;
                  (paint->u).transform.affine.xx = FVar21;
                  if ((FVar26 & (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_LINEAR_GRADIENT)) ==
                      FT_COLR_PAINTFORMAT_SCALE) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 2)) < puVar22) {
                      return '\0';
                    }
                    puVar22 = local_50 + 1;
                    FVar21 = ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
                             (ulong)*(byte *)((long)local_50 + 3)) << 2;
                  }
                  (paint->u).transform.affine.xy = FVar21;
                  if ((FVar26 < FT_COLR_PAINTFORMAT_ROTATE) &&
                     ((0xcc0000U >>
                       (FVar26 & (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                                 FT_COLR_PAINTFORMAT_COLR_LAYERS)) & 1) != 0)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    (paint->u).linear_gradient.p0.x =
                         ((long)(short)((ushort)(byte)*puVar22 << 8) |
                         (ulong)*(byte *)((long)puVar22 + 1)) << 0x10;
                    puVar7 = (ushort *)((long)puVar22 + 2);
                    pbVar8 = (byte *)((long)puVar22 + 3);
                    puVar22 = puVar22 + 1;
                    (paint->u).linear_gradient.p0.y =
                         ((long)(short)((ushort)*(byte *)puVar7 << 8) | (ulong)*pbVar8) << 0x10;
                  }
                  else {
                    *(FT_Pos *)((long)&paint->u + 0x20) = 0;
                    *(FT_Pos *)((long)&paint->u + 0x28) = 0;
                  }
                  if ((FVar26 < FT_COLR_PAINTFORMAT_ROTATE) &&
                     ((0xaa0000U >>
                       (FVar26 & (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                                 FT_COLR_PAINTFORMAT_COLR_LAYERS)) & 1) != 0)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    local_50 = puVar22 + 1;
                    uVar20 = *puVar22;
                    uVar25 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,2,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar36._4_4_ = local_48.xx._4_4_;
                      auVar36._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar36._8_4_ = local_48.xx._4_4_;
                      auVar36._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
                      (paint->u).transform.affine.xx =
                           (paint->u).transform.affine.xx +
                           CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                                    CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 4;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar36._8_8_ * 4;
                      FVar26 = paint->format;
                    }
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_SOLID|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,4,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar37._4_4_ = local_48.xx._4_4_;
                      auVar37._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar37._8_4_ = local_48.xx._4_4_;
                      auVar37._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
                      (paint->u).transform.affine.xx =
                           (paint->u).transform.affine.xx +
                           CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                                    CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 4;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar37._8_8_ * 4;
                      auVar38._4_4_ = local_48.xy._4_4_;
                      auVar38._0_4_ = (int)local_48.xy;
                      auVar38._8_4_ = local_48.xy._4_4_;
                      auVar38._12_4_ = -(uint)(local_48.xy._4_4_ < 0);
                      *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
                           *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform +
                           CONCAT44(-(uint)((int)local_48.xy < 0),(int)local_48.xy) * 0x10000;
                      (paint->u).linear_gradient.p0.y =
                           (paint->u).linear_gradient.p0.y + auVar38._8_8_ * 0x10000;
                      FVar26 = paint->format;
                    }
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_LINEAR_GRADIENT|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,1,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar40._0_8_ = (long)CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar40._8_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar40._12_4_ = (int)local_48.xx._2_2_ >> 0xf;
                      (paint->u).transform.affine.xx =
                           auVar40._0_8_ * 4 + (paint->u).transform.affine.xx;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar40._8_8_ * 4;
                      FVar26 = paint->format;
                    }
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,3,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar39._0_8_ = (long)CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar39._8_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar39._12_4_ = (int)local_48.xx._2_2_ >> 0xf;
                      lVar18 = *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform;
                      lVar17 = (paint->u).linear_gradient.p0.y;
                      (paint->u).transform.affine.xx =
                           (paint->u).transform.affine.xx + auVar39._0_8_ * 4;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar39._8_8_ * 4;
                      auVar41._4_4_ = (int)local_48.xy;
                      auVar41._0_4_ = local_48.xx._4_4_;
                      auVar41._8_4_ = (int)local_48.xy;
                      auVar41._12_4_ = -(uint)((int)local_48.xy < 0);
                      *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
                           CONCAT44(-(uint)(local_48.xx._4_4_ < 0),local_48.xx._4_4_) * 0x10000 +
                           lVar18;
                      (paint->u).linear_gradient.p0.y = auVar41._8_8_ * 0x10000 + lVar17;
                    }
                  }
                  paint->format = FT_COLR_PAINTFORMAT_SCALE;
                  return '\x01';
                }
                if (FVar26 - FT_COLR_PAINTFORMAT_ROTATE < 4) {
                  (paint->u).glyph.paint.p = child_table_p;
                  *(undefined1 *)((long)&paint->u + 8) = 0;
                  if (local_50 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_50) {
                    return '\0';
                  }
                  puVar22 = (uint *)((long)local_50 + 2);
                  (paint->u).transform.affine.xx =
                       ((long)(short)((ushort)(byte)*local_50 << 8) |
                       (ulong)*(byte *)((long)local_50 + 1)) << 2;
                  if ((FVar26 & ~FT_COLR_PAINTFORMAT_COLR_LAYERS) ==
                      (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    (paint->u).transform.affine.xy =
                         ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
                         (ulong)*(byte *)((long)local_50 + 3)) << 0x10;
                    puVar22 = (uint *)((long)local_50 + 6);
                    (paint->u).linear_gradient.p0.x =
                         ((long)(short)((ushort)(byte)local_50[1] << 8) |
                         (ulong)*(byte *)((long)local_50 + 5)) << 0x10;
                  }
                  else {
                    *(FT_Byte **)((long)&paint->u + 0x18) = (FT_Byte *)0x0;
                    *(FT_Bool *)((long)&paint->u + 0x20) = '\0';
                    *(undefined7 *)((long)&paint->u + 0x21) = 0;
                  }
                  if ((FVar26 | FT_COLR_PAINTFORMAT_SOLID) ==
                      (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID|
                      FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    num_deltas = 1;
                    if (FVar26 != (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      num_deltas = (uint)(FVar26 ==
                                         (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID|
                                         FT_COLR_PAINTFORMAT_COLR_LAYERS)) * 3;
                    }
                    if (num_deltas != 0) {
                      uVar20 = *puVar22;
                      get_deltas_for_var_index_base
                                (face,colr,
                                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                         (uVar20 & 0xff00) << 8 | uVar20 << 0x18),num_deltas,
                                 (FT_ItemVarDelta *)&local_48);
                      pFVar2 = &(paint->u).transform.affine;
                      pFVar2->xx = pFVar2->xx +
                                   (long)CONCAT22(local_48.xx._2_2_,(short)local_48.xx) * 4;
                      if (FVar26 == (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID|
                                    FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        auVar35._4_4_ = (int)local_48.xy;
                        auVar35._0_4_ = local_48.xx._4_4_;
                        auVar35._8_4_ = (int)local_48.xy;
                        auVar35._12_4_ = -(uint)((int)local_48.xy < 0);
                        lVar18 = *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform
                        ;
                        (paint->u).composite.backdrop_paint.p =
                             (paint->u).composite.backdrop_paint.p +
                             CONCAT44(-(uint)(local_48.xx._4_4_ < 0),local_48.xx._4_4_) * 0x10000;
                        *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
                             lVar18 + auVar35._8_8_ * 0x10000;
                      }
                    }
                  }
                  paint->format = FT_COLR_PAINTFORMAT_ROTATE;
                  return '\x01';
                }
                if (FVar26 - FT_COLR_PAINTFORMAT_SKEW < 4) {
                  (paint->u).glyph.paint.p = child_table_p;
                  *(undefined1 *)((long)&paint->u + 8) = 0;
                  if (local_50 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50) {
                    return '\0';
                  }
                  (paint->u).transform.affine.xx =
                       ((long)(short)((ushort)(byte)*local_50 << 8) |
                       (ulong)*(byte *)((long)local_50 + 1)) << 2;
                  puVar22 = local_50 + 1;
                  (paint->u).transform.affine.xy =
                       ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
                       (ulong)*(byte *)((long)local_50 + 3)) << 2;
                  if ((FVar26 & ~FT_COLR_PAINTFORMAT_COLR_LAYERS) ==
                      (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    (paint->u).linear_gradient.p0.x =
                         ((long)(short)((ushort)(byte)local_50[1] << 8) |
                         (ulong)*(byte *)((long)local_50 + 5)) << 0x10;
                    puVar22 = local_50 + 2;
                    (paint->u).linear_gradient.p0.y =
                         ((long)(short)((ushort)*(byte *)((long)local_50 + 6) << 8) |
                         (ulong)*(byte *)((long)local_50 + 7)) << 0x10;
                  }
                  else {
                    *(FT_Pos *)((long)&paint->u + 0x20) = 0;
                    *(FT_Pos *)((long)&paint->u + 0x28) = 0;
                  }
                  if ((FVar26 | FT_COLR_PAINTFORMAT_SOLID) ==
                      (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                      FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                    if (puVar22 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar22) {
                      return '\0';
                    }
                    uVar20 = *puVar22;
                    uVar25 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,2,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar33._4_4_ = local_48.xx._4_4_;
                      auVar33._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar33._8_4_ = local_48.xx._4_4_;
                      auVar33._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
                      (paint->u).transform.affine.xx =
                           (paint->u).transform.affine.xx +
                           CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                                    CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 4;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar33._8_8_ * 4;
                      FVar26 = paint->format;
                    }
                    if (FVar26 == (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      get_deltas_for_var_index_base(face,colr,uVar25,4,(FT_ItemVarDelta *)&local_48)
                      ;
                      auVar34._4_4_ = local_48.xx._4_4_;
                      auVar34._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                      auVar34._8_4_ = local_48.xx._4_4_;
                      auVar34._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
                      lVar18 = *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform;
                      lVar17 = (paint->u).linear_gradient.p0.y;
                      (paint->u).transform.affine.xx =
                           (paint->u).transform.affine.xx +
                           CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                                    CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 4;
                      (paint->u).composite.backdrop_paint.p =
                           (paint->u).composite.backdrop_paint.p + auVar34._8_8_ * 4;
                      auVar45._4_4_ = local_48.xy._4_4_;
                      auVar45._0_4_ = (int)local_48.xy;
                      auVar45._8_4_ = local_48.xy._4_4_;
                      auVar45._12_4_ = -(uint)(local_48.xy._4_4_ < 0);
                      *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
                           CONCAT44(-(uint)((int)local_48.xy < 0),(int)local_48.xy) * 0x10000 +
                           lVar18;
                      (paint->u).linear_gradient.p0.y = auVar45._8_8_ * 0x10000 + lVar17;
                    }
                  }
                  paint->format = FT_COLR_PAINTFORMAT_SKEW;
                  return '\x01';
                }
                if (FVar26 != FT_COLR_PAINTFORMAT_COMPOSITE) {
                  return '\0';
                }
                (paint->u).glyph.paint.p = child_table_p;
                *(undefined1 *)((long)&paint->u + 8) = 0;
                if (local_50 < colr->paints_start_v1) {
                  return '\0';
                }
                if ((uint *)((long)colr->table + (colr->table_size - 1)) < local_50) {
                  return '\0';
                }
                if (0x1b < (byte)*local_50) {
                  return '\0';
                }
                (paint->u).glyph.glyphID = (uint)(byte)*local_50;
                local_50 = (uint *)((long)local_50 + 1);
                FVar16 = get_child_table_pointer
                                   (colr,(FT_Byte *)puVar22,(FT_Byte **)&local_50,&child_table_p);
                if (FVar16 == '\0') {
                  return '\0';
                }
                (paint->u).composite.backdrop_paint.p = child_table_p;
                *(undefined1 *)((long)&paint->u + 0x20) = 0;
                return '\x01';
              case FT_COLR_PAINTFORMAT_TRANSFORM:
              case FT_COLR_PAINTFORMAT_TRANSFORM|FT_COLR_PAINTFORMAT_COLR_LAYERS:
                (paint->u).glyph.paint.p = child_table_p;
                *(undefined1 *)((long)&paint->u + 8) = 0;
                FVar16 = get_child_table_pointer
                                   (colr,(FT_Byte *)puVar22,(FT_Byte **)&local_50,&child_table_p);
                if (FVar16 == '\0') {
                  return '\0';
                }
                if (child_table_p < colr->paints_start_v1) {
                  return '\0';
                }
                if ((FT_Byte *)((long)colr->table + (colr->table_size - 0x18)) < child_table_p) {
                  return '\0';
                }
                (paint->u).transform.affine.xx =
                     (ulong)child_table_p[3] |
                     (ulong)child_table_p[2] << 8 |
                     (long)(int)((uint)*child_table_p << 0x18) | (ulong)child_table_p[1] << 0x10;
                (paint->u).linear_gradient.p0.y =
                     (ulong)child_table_p[7] |
                     (ulong)child_table_p[6] << 8 |
                     (long)(int)((uint)child_table_p[4] << 0x18) | (ulong)child_table_p[5] << 0x10;
                (paint->u).transform.affine.xy =
                     (ulong)child_table_p[0xb] |
                     (ulong)child_table_p[10] << 8 |
                     (long)(int)((uint)child_table_p[8] << 0x18) | (ulong)child_table_p[9] << 0x10;
                (paint->u).linear_gradient.p1.x =
                     (ulong)child_table_p[0xf] |
                     (ulong)child_table_p[0xe] << 8 |
                     (long)(int)((uint)child_table_p[0xc] << 0x18) |
                     (ulong)child_table_p[0xd] << 0x10;
                (paint->u).linear_gradient.p0.x =
                     (ulong)child_table_p[0x13] |
                     (ulong)child_table_p[0x12] << 8 |
                     (long)(int)((uint)child_table_p[0x10] << 0x18) |
                     (ulong)child_table_p[0x11] << 0x10;
                (paint->u).linear_gradient.p1.y =
                     (ulong)child_table_p[0x17] |
                     (ulong)child_table_p[0x16] << 8 |
                     (long)(int)((uint)child_table_p[0x14] << 0x18) |
                     (ulong)child_table_p[0x15] << 0x10;
                if (paint->format == (FT_COLR_PAINTFORMAT_TRANSFORM|FT_COLR_PAINTFORMAT_COLR_LAYERS)
                   ) {
                  if (child_table_p + 0x18 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((FT_Byte *)((long)colr->table + (colr->table_size - 4)) < child_table_p + 0x18
                     ) {
                    return '\0';
                  }
                  uVar20 = *(uint *)(child_table_p + 0x18);
                  get_deltas_for_var_index_base
                            (face,colr,
                             (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18),6,
                             (FT_ItemVarDelta *)&local_48);
                  pFVar2 = &(paint->u).transform.affine;
                  pFVar2->xx = pFVar2->xx + (long)CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                  pFVar3 = &(paint->u).linear_gradient.p0.y;
                  *pFVar3 = *pFVar3 + (long)local_48.xx._4_4_;
                  pFVar4 = &(paint->u).composite.backdrop_paint;
                  pFVar4->p = pFVar4->p + (int)local_48.xy;
                  pFVar5 = &(paint->u).linear_gradient.p1;
                  pFVar5->x = pFVar5->x + (long)local_48.xy._4_4_;
                  pFVar6 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                  *(long *)pFVar6 = *(long *)pFVar6 + (long)(int)local_48.yx;
                  pFVar3 = &(paint->u).linear_gradient.p1.y;
                  *pFVar3 = *pFVar3 + (long)local_48.yx._4_4_;
                }
                paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;
                return '\x01';
              case FT_COLR_PAINTFORMAT_TRANSLATE:
              case FT_COLR_PAINTFORMAT_TRANSLATE|FT_COLR_PAINTFORMAT_COLR_LAYERS:
                (paint->u).glyph.paint.p = child_table_p;
                *(undefined1 *)((long)&paint->u + 8) = 0;
                if (local_50 < colr->paints_start_v1) {
                  return '\0';
                }
                if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50) {
                  return '\0';
                }
                (paint->u).transform.affine.xx =
                     ((long)(short)((ushort)(byte)*local_50 << 8) |
                     (ulong)*(byte *)((long)local_50 + 1)) << 0x10;
                (paint->u).transform.affine.xy =
                     ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
                     (ulong)*(byte *)((long)local_50 + 3)) << 0x10;
                if (FVar26 == (FT_COLR_PAINTFORMAT_TRANSLATE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                  if (local_50 + 1 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50 + 1) {
                    return '\0';
                  }
                  uVar20 = local_50[1];
                  get_deltas_for_var_index_base
                            (face,colr,
                             (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18),2,
                             (FT_ItemVarDelta *)&local_48);
                  auVar31._4_4_ = local_48.xx._4_4_;
                  auVar31._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
                  auVar31._8_4_ = local_48.xx._4_4_;
                  auVar31._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
                  (paint->u).transform.affine.xx =
                       (paint->u).transform.affine.xx +
                       CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                                CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 0x10000;
                  (paint->u).composite.backdrop_paint.p =
                       (paint->u).composite.backdrop_paint.p + auVar31._8_8_ * 0x10000;
                }
                paint->format = FT_COLR_PAINTFORMAT_TRANSLATE;
                return '\x01';
              }
            }
            FVar16 = read_color_line(colr,child_table_p,(FT_ColorLine *)&(paint->u).colr_layers,
                                     FVar16);
            if (FVar16 == '\0') {
              return '\0';
            }
            if (local_50 < colr->paints_start_v1) {
              return '\0';
            }
            if ((uint *)((long)colr->table + (colr->table_size - 8)) < local_50) {
              return '\0';
            }
            (paint->u).linear_gradient.p0.x =
                 ((long)(short)((ushort)(byte)*local_50 << 8) | (ulong)*(byte *)((long)local_50 + 1)
                 ) << 0x10;
            (paint->u).linear_gradient.p0.y =
                 ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
                 (ulong)*(byte *)((long)local_50 + 3)) << 0x10;
            (paint->u).linear_gradient.p1.x =
                 ((long)(short)((ushort)(byte)local_50[1] << 8) |
                 (ulong)*(byte *)((long)local_50 + 5)) << 2;
            (paint->u).linear_gradient.p1.y =
                 ((long)(short)((ushort)*(byte *)((long)local_50 + 6) << 8) |
                 (ulong)*(byte *)((long)local_50 + 7)) << 2;
            if (FVar26 != FT_COLR_PAINTFORMAT_SWEEP_GRADIENT) {
              if (local_50 + 2 < colr->paints_start_v1) {
                return '\0';
              }
              if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50 + 2) {
                return '\0';
              }
              uVar20 = local_50[2];
              get_deltas_for_var_index_base
                        (face,colr,
                         (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                | uVar20 << 0x18),4,(FT_ItemVarDelta *)&local_48);
              auVar32._4_4_ = local_48.xx._4_4_;
              auVar32._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
              auVar32._8_4_ = local_48.xx._4_4_;
              auVar32._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
              lVar18 = (paint->u).linear_gradient.p1.x;
              lVar17 = (paint->u).linear_gradient.p1.y;
              *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
                   *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform +
                   CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                            CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 0x10000;
              (paint->u).linear_gradient.p0.y =
                   (paint->u).linear_gradient.p0.y + auVar32._8_8_ * 0x10000;
              auVar44._4_4_ = local_48.xy._4_4_;
              auVar44._0_4_ = (int)local_48.xy;
              auVar44._8_4_ = local_48.xy._4_4_;
              auVar44._12_4_ = -(uint)(local_48.xy._4_4_ < 0);
              (paint->u).linear_gradient.p1.x =
                   CONCAT44(-(uint)((int)local_48.xy < 0),(int)local_48.xy) * 4 + lVar18;
              (paint->u).linear_gradient.p1.y = auVar44._8_8_ * 4 + lVar17;
            }
            paint->format = FT_COLR_PAINTFORMAT_SWEEP_GRADIENT;
            return '\x01';
          }
        }
        FVar16 = read_color_line(colr,child_table_p,(FT_ColorLine *)&(paint->u).colr_layers,FVar16);
        if (FVar16 == '\0') {
          return '\0';
        }
        if (local_50 < colr->paints_start_v1) {
          return '\0';
        }
        if ((uint *)((long)colr->table + (colr->table_size - 0xc)) < local_50) {
          return '\0';
        }
        (paint->u).linear_gradient.p0.x =
             ((long)(short)((ushort)(byte)*local_50 << 8) | (ulong)*(byte *)((long)local_50 + 1)) <<
             0x10;
        (paint->u).linear_gradient.p0.y =
             ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
             (ulong)*(byte *)((long)local_50 + 3)) << 0x10;
        sVar19 = (ushort)(byte)local_50[1] << 8;
        FVar24 = ((long)sVar19 | (ulong)*(byte *)((long)local_50 + 5)) << 0x10;
        if (sVar19 < 0) {
          FVar24 = 0x7fffffff;
        }
        (paint->u).linear_gradient.p1.x = FVar24;
        (paint->u).linear_gradient.p1.y =
             ((long)(short)((ushort)*(byte *)((long)local_50 + 6) << 8) |
             (ulong)*(byte *)((long)local_50 + 7)) << 0x10;
        (paint->u).linear_gradient.p2.x =
             ((long)(short)((ushort)(byte)local_50[2] << 8) | (ulong)*(byte *)((long)local_50 + 9))
             << 0x10;
        sVar19 = (ushort)*(byte *)((long)local_50 + 10) << 8;
        FVar24 = ((long)sVar19 | (ulong)*(byte *)((long)local_50 + 0xb)) << 0x10;
        if (sVar19 < 0) {
          FVar24 = 0x7fffffff;
        }
        (paint->u).linear_gradient.p2.y = FVar24;
        if (FVar26 != FT_COLR_PAINTFORMAT_RADIAL_GRADIENT) {
          if (local_50 + 3 < colr->paints_start_v1) {
            return '\0';
          }
          if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50 + 3) {
            return '\0';
          }
          uVar20 = local_50[3];
          get_deltas_for_var_index_base
                    (face,colr,
                     (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18),6,(FT_ItemVarDelta *)&local_48);
          auVar29._4_4_ = local_48.xx._4_4_;
          auVar29._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
          auVar29._8_4_ = local_48.xx._4_4_;
          auVar29._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
          lVar18 = (paint->u).linear_gradient.p1.x;
          lVar17 = (paint->u).linear_gradient.p1.y;
          lVar14 = (paint->u).linear_gradient.p2.x;
          lVar15 = (paint->u).linear_gradient.p2.y;
          *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
               *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform +
               CONCAT44(-(uint)(local_48.xx._2_2_ < 0),
                        CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) * 0x10000;
          (paint->u).linear_gradient.p0.y =
               (paint->u).linear_gradient.p0.y + auVar29._8_8_ * 0x10000;
          auVar43._4_4_ = local_48.xy._4_4_;
          auVar43._0_4_ = (int)local_48.xy;
          auVar43._8_4_ = local_48.xy._4_4_;
          auVar43._12_4_ = -(uint)(local_48.xy._4_4_ < 0);
          (paint->u).linear_gradient.p1.x =
               CONCAT44(-(uint)((int)local_48.xy < 0),(int)local_48.xy) * 0x10000 + lVar18;
          (paint->u).linear_gradient.p1.y = auVar43._8_8_ * 0x10000 + lVar17;
          auVar30._4_4_ = local_48.yx._4_4_;
          auVar30._0_4_ = (int)local_48.yx;
          auVar30._8_4_ = local_48.yx._4_4_;
          auVar30._12_4_ = -(uint)(local_48.yx._4_4_ < 0);
          (paint->u).linear_gradient.p2.x =
               CONCAT44(-(uint)((int)local_48.yx < 0),(int)local_48.yx) * 0x10000 + lVar14;
          (paint->u).linear_gradient.p2.y = auVar30._8_8_ * 0x10000 + lVar15;
        }
        paint->format = FT_COLR_PAINTFORMAT_RADIAL_GRADIENT;
        return '\x01';
      }
    }
    FVar16 = read_color_line(colr,child_table_p,(FT_ColorLine *)&(paint->u).colr_layers,FVar16);
    if (((FVar16 == '\0') || (local_50 < colr->paints_start_v1)) ||
       ((uint *)((long)colr->table + (colr->table_size - 0xc)) < local_50)) {
      return '\0';
    }
    (paint->u).linear_gradient.p0.x =
         ((long)(short)((ushort)(byte)*local_50 << 8) | (ulong)*(byte *)((long)local_50 + 1)) <<
         0x10;
    (paint->u).linear_gradient.p0.y =
         ((long)(short)((ushort)*(byte *)((long)local_50 + 2) << 8) |
         (ulong)*(byte *)((long)local_50 + 3)) << 0x10;
    (paint->u).linear_gradient.p1.x =
         ((long)(short)((ushort)(byte)local_50[1] << 8) | (ulong)*(byte *)((long)local_50 + 5)) <<
         0x10;
    (paint->u).linear_gradient.p1.y =
         ((long)(short)((ushort)*(byte *)((long)local_50 + 6) << 8) |
         (ulong)*(byte *)((long)local_50 + 7)) << 0x10;
    (paint->u).linear_gradient.p2.x =
         ((long)(short)((ushort)(byte)local_50[2] << 8) | (ulong)*(byte *)((long)local_50 + 9)) <<
         0x10;
    (paint->u).linear_gradient.p2.y =
         ((long)(short)((ushort)*(byte *)((long)local_50 + 10) << 8) |
         (ulong)*(byte *)((long)local_50 + 0xb)) << 0x10;
    if (FVar26 != FT_COLR_PAINTFORMAT_LINEAR_GRADIENT) {
      if (local_50 + 3 < colr->paints_start_v1) {
        return '\0';
      }
      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_50 + 3) {
        return '\0';
      }
      uVar20 = local_50[3];
      get_deltas_for_var_index_base
                (face,colr,
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18),6,(FT_ItemVarDelta *)&local_48);
      auVar27._4_4_ = local_48.xx._4_4_;
      auVar27._0_4_ = CONCAT22(local_48.xx._2_2_,(short)local_48.xx);
      auVar27._8_4_ = local_48.xx._4_4_;
      auVar27._12_4_ = -(uint)(local_48.xx._4_4_ < 0);
      lVar18 = (paint->u).linear_gradient.p1.x;
      lVar17 = (paint->u).linear_gradient.p1.y;
      lVar14 = (paint->u).linear_gradient.p2.x;
      lVar15 = (paint->u).linear_gradient.p2.y;
      *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform =
           *(long *)&(paint->u).composite.backdrop_paint.insert_root_transform +
           CONCAT44(-(uint)(local_48.xx._2_2_ < 0),CONCAT22(local_48.xx._2_2_,(short)local_48.xx)) *
           0x10000;
      (paint->u).linear_gradient.p0.y = (paint->u).linear_gradient.p0.y + auVar27._8_8_ * 0x10000;
      auVar42._4_4_ = local_48.xy._4_4_;
      auVar42._0_4_ = (int)local_48.xy;
      auVar42._8_4_ = local_48.xy._4_4_;
      auVar42._12_4_ = -(uint)(local_48.xy._4_4_ < 0);
      (paint->u).linear_gradient.p1.x =
           CONCAT44(-(uint)((int)local_48.xy < 0),(int)local_48.xy) * 0x10000 + lVar18;
      (paint->u).linear_gradient.p1.y = auVar42._8_8_ * 0x10000 + lVar17;
      auVar28._4_4_ = local_48.yx._4_4_;
      auVar28._0_4_ = (int)local_48.yx;
      auVar28._8_4_ = local_48.yx._4_4_;
      auVar28._12_4_ = -(uint)(local_48.yx._4_4_ < 0);
      (paint->u).linear_gradient.p2.x =
           CONCAT44(-(uint)((int)local_48.yx < 0),(int)local_48.yx) * 0x10000 + lVar14;
      (paint->u).linear_gradient.p2.y = auVar28._8_8_ * 0x10000 + lVar15;
    }
    paint->format = FT_COLR_PAINTFORMAT_LINEAR_GRADIENT;
    return '\x01';
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_paint( TT_Face         face,
                     FT_OpaquePaint  opaque_paint,
                     FT_COLR_Paint*  paint )
  {
    Colr*           colr = (Colr*)face->colr;
    FT_OpaquePaint  next_paint;
    FT_Matrix       ft_root_scale;

    if ( !colr || !colr->base_glyphs_v1 || !colr->table )
      return 0;

    if ( opaque_paint.insert_root_transform )
    {
      /* 'COLR' v1 glyph information is returned in unscaled coordinates,
       * i.e., `FT_Size` is not applied or multiplied into the values.  When
       * client applications draw color glyphs, they can request to include
       * a top-level transform, which includes the active `x_scale` and
       * `y_scale` information for scaling the glyph, as well the additional
       * transform and translate configured through `FT_Set_Transform`.
       * This allows client applications to apply this top-level transform
       * to the graphics context first and only once, then have gradient and
       * contour scaling applied correctly when performing the additional
       * drawing operations for subsequenct paints.  Prepare this initial
       * transform here.
       */
      paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;

      next_paint.p                     = opaque_paint.p;
      next_paint.insert_root_transform = 0;
      paint->u.transform.paint         = next_paint;

      /* `x_scale` and `y_scale` are in 26.6 format, representing the scale
       * factor to get from font units to requested size.  However, expected
       * return values are in 16.16, so we shift accordingly with rounding.
       */
      ft_root_scale.xx = ( face->root.size->metrics.x_scale + 32 ) >> 6;
      ft_root_scale.xy = 0;
      ft_root_scale.yx = 0;
      ft_root_scale.yy = ( face->root.size->metrics.y_scale + 32 ) >> 6;

      if ( face->root.internal->transform_flags & 1 )
        FT_Matrix_Multiply( &face->root.internal->transform_matrix,
                            &ft_root_scale );

      paint->u.transform.affine.xx = ft_root_scale.xx;
      paint->u.transform.affine.xy = ft_root_scale.xy;
      paint->u.transform.affine.yx = ft_root_scale.yx;
      paint->u.transform.affine.yy = ft_root_scale.yy;

      /* The translation is specified in 26.6 format and, according to the
       * documentation of `FT_Set_Translate`, is performed on the character
       * size given in the last call to `FT_Set_Char_Size`.  The
       * 'PaintTransform' paint table's `FT_Affine23` format expects
       * values in 16.16 format, thus we need to shift by 10 bits.
       */
      if ( face->root.internal->transform_flags & 2 )
      {
        paint->u.transform.affine.dx =
          face->root.internal->transform_delta.x * ( 1 << 10 );
        paint->u.transform.affine.dy =
          face->root.internal->transform_delta.y * ( 1 << 10 );
      }
      else
      {
        paint->u.transform.affine.dx = 0;
        paint->u.transform.affine.dy = 0;
      }

      return 1;
    }

    return read_paint( face, colr, opaque_paint.p, paint );
  }